

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

IterateResult __thiscall
gl3cts::TransformFeedback::DrawXFBStreamInstanced::iterate(DrawXFBStreamInstanced *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ContextType CVar8;
  char *description;
  TestContext *this_00;
  undefined1 local_1b0 [384];
  
  CVar8.super_ApiType.m_bits = (ApiType)(*this->m_context->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(CVar8,(ApiType)0x113);
  CVar8.super_ApiType.m_bits = (ApiType)(*this->m_context->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(CVar8,(ApiType)0x104);
  CVar8.super_ApiType.m_bits = (ApiType)(*this->m_context->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(CVar8,(ApiType)0x124);
  bVar5 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_ARB_transform_feedback_instanced");
  bVar6 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_ARB_uniform_buffer_object");
  bVar7 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_ARB_gpu_shader5");
  if ((bVar4) || (bVar5 && (bVar3 || (bVar2 || bVar6) && bVar7))) {
    prepareObjects(this);
    drawForXFB(this);
    drawStreamInstanced(this);
    bVar2 = check(this);
  }
  else {
    bVar2 = true;
  }
  clean(this);
  if (bVar2 == false) {
    local_1b0._0_8_ = this->m_context->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Draw XFB Stream Instanced have failed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Fail";
  }
  else {
    local_1b0._0_8_ = this->m_context->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Draw XFB Stream Instanced have passed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
  }
  tcu::TestContext::setTestResult(this_00,(uint)(bVar2 == false),description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::TransformFeedback::DrawXFBStreamInstanced::iterate(void)
{
	/* Initializations. */
	bool is_at_least_gl_31   = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 1)));
	bool is_at_least_gl_40   = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 0)));
	bool is_at_least_gl_42   = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 2)));
	bool is_arb_tf_instanced = m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback_instanced");
	bool is_arb_ubo			 = m_context.getContextInfo().isExtensionSupported("GL_ARB_uniform_buffer_object");
	bool is_arb_gpu_shader5  = m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader5");

	bool is_ok		= true;
	bool test_error = false;

	/* Test. */
	try
	{
		if (is_at_least_gl_42 || ((is_at_least_gl_31 || is_arb_ubo) && is_arb_gpu_shader5 && is_arb_tf_instanced) ||
			(is_at_least_gl_40 && is_arb_tf_instanced))
		{
			prepareObjects();
			drawForXFB();
			drawStreamInstanced();

			is_ok = is_ok && check();
		}
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
	}

	/* Clean GL objects */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		/* Log success. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB Stream Instanced have passed."
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			/* Log error. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Draw XFB Stream Instanced have approached error."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			/* Log fail. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB Stream Instanced have failed."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}